

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT8 __thiscall VGMPlayer::SetDeviceOptions(VGMPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong uVar1;
  DEVFUNC_OPTMASK p_Var2;
  UINT8 UVar3;
  size_t sVar4;
  VGMPlayer *this_00;
  VGM_BASEDEV *clDev;
  pointer pCVar5;
  long lVar6;
  bool bVar7;
  
  sVar4 = DeviceID2OptionID(this,id);
  if (sVar4 == 0xffffffffffffffff) {
    UVar3 = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar4,devOpts,0xa0);
    uVar1 = this->_optDevMap[sVar4];
    pCVar5 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)(((long)(this->_devices).
                               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 4) *
                       -0x1111111111111111)) {
      RefreshDevOptions(this,pCVar5 + uVar1,this->_devOpts + sVar4);
      pCVar5 = (this->_devices).
               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar1;
      lVar6 = 0;
      do {
        this_00 = (VGMPlayer *)(pCVar5->base).defInf.dataPtr;
        if ((this_00 != (VGMPlayer *)0x0) &&
           (p_Var2 = ((pCVar5->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
          (*p_Var2)(this_00,*(UINT32 *)((long)this->_devOpts[sVar4].muteOpts.chnMute + lVar6));
        }
        pCVar5 = (pointer)(pCVar5->base).linkDev;
      } while ((pCVar5 != (pointer)0x0) && (bVar7 = lVar6 == 0, lVar6 = lVar6 + 4, bVar7));
      RefreshPanning(this_00,(this->_devices).
                             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar1,
                     &this->_devOpts[sVar4].panOpts);
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UINT8 VGMPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
	{
		DEV_INFO* devInf = &_devices[devID].base.defInf;
		RefreshDevOptions(_devices[devID], _devOpts[optID]);
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
		RefreshPanning(_devices[devID], _devOpts[optID].panOpts);
	}
	return 0x00;
}